

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O0

PSNodesBlock * __thiscall
dg::pta::LLVMPointerGraphBuilder::buildPointerGraphBlock
          (LLVMPointerGraphBuilder *this,BasicBlock *block,PointerSubgraph *parent)

{
  bool bVar1;
  reference this_00;
  reference ppPVar2;
  PointerSubgraph *in_RCX;
  undefined8 in_RDX;
  Instruction *in_RSI;
  Instruction *in_RDI;
  PSNode *nd;
  iterator __end3;
  iterator __begin3;
  PSNodesSeq *__range3;
  PSNodesSeq *seq;
  Instruction *Inst;
  const_iterator __end2;
  const_iterator __begin2;
  BasicBlock *__range2;
  PSNodesBlock *blk;
  PSNodesSeq *in_stack_ffffffffffffff68;
  Instruction *this_01;
  PSNode *in_stack_ffffffffffffff88;
  __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  local_68;
  PSNodesSeq *local_60;
  PSNodesSeq *in_stack_ffffffffffffffa8;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
  local_40;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
  local_38;
  undefined8 local_30;
  undefined1 local_21;
  PointerSubgraph *local_20;
  undefined8 local_18;
  
  local_21 = 0;
  this_01 = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  PSNodesBlock::PSNodesBlock((PSNodesBlock *)0x1b0cb8);
  local_30 = local_18;
  local_38.NodePtr = (node_pointer)llvm::BasicBlock::begin((BasicBlock *)in_stack_ffffffffffffff68);
  local_40.NodePtr = (node_pointer)llvm::BasicBlock::end((BasicBlock *)in_stack_ffffffffffffff68);
  while (bVar1 = llvm::operator!=(&local_38,&local_40), bVar1) {
    this_00 = llvm::
              ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
              ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                           *)0x1b0d05);
    bVar1 = isRelevantInstruction((LLVMPointerGraphBuilder *)this_01,in_RDI);
    if (bVar1) {
      local_60 = buildInstruction((LLVMPointerGraphBuilder *)in_stack_ffffffffffffff88,in_RSI);
      in_stack_ffffffffffffffa8 = local_60;
      local_68._M_current = (PSNode **)PSNodesSeq::begin(in_stack_ffffffffffffff68);
      PSNodesSeq::end(in_stack_ffffffffffffff68);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                                 *)in_RDI,
                                (__normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                                 *)in_stack_ffffffffffffff68), bVar1) {
        ppPVar2 = __gnu_cxx::
                  __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                  ::operator*(&local_68);
        in_stack_ffffffffffffff88 = *ppPVar2;
        PSNode::setParent(in_stack_ffffffffffffff88,local_20);
        __gnu_cxx::
        __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
        ::operator++(&local_68);
      }
      PSNodesBlock::append((PSNodesBlock *)in_RDI,in_stack_ffffffffffffff68);
    }
    else {
      bVar1 = llvm::isa<llvm::MemSetInst,llvm::Instruction_const*>((Instruction **)0x1b0d31);
      if (bVar1) {
        checkMemSet((LLVMPointerGraphBuilder *)this_00,(Instruction *)in_stack_ffffffffffffffa8);
      }
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
    ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                  *)in_RDI);
  }
  return (PSNodesBlock *)this_01;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesBlock
LLVMPointerGraphBuilder::buildPointerGraphBlock(const llvm::BasicBlock &block,
                                                PointerSubgraph *parent) {
    PSNodesBlock blk;

    for (const llvm::Instruction &Inst : block) {
        if (!isRelevantInstruction(Inst)) {
            // check if it is a zeroing of memory,
            // if so, set the corresponding memory to zeroed
            if (llvm::isa<llvm::MemSetInst>(&Inst))
                checkMemSet(&Inst);

            continue;
        }

        assert(nodes_map.count(&Inst) == 0 && "Already built this instruction");
        auto &seq = buildInstruction(Inst);

        // set parent to the new nodes
        for (auto *nd : seq) {
            nd->setParent(parent);
        }

        blk.append(&seq);
    }

    return blk;
}